

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall sznet::net::TcpConnection::handleRead(TcpConnection *this,Timestamp receiveTime)

{
  bool bVar1;
  sz_fd fd;
  pointer this_00;
  LogStream *this_01;
  SourceFile file;
  bool local_1041;
  enable_shared_from_this<sznet::net::TcpConnection> local_1028 [2];
  undefined1 local_1008 [12];
  Logger local_ff8;
  sz_ssize_t local_28;
  sz_ssize_t n;
  TcpConnection *pTStack_18;
  int savedErrno;
  TcpConnection *this_local;
  Timestamp receiveTime_local;
  
  pTStack_18 = this;
  this_local = (TcpConnection *)receiveTime.m_microSecondsSinceEpoch;
  EventLoop::assertInLoopThread(this->m_loop);
  n._4_4_ = 0;
  local_28 = 0;
  while( true ) {
    do {
      this_00 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
                operator->(&this->m_channel);
      fd = Channel::fd(this_00);
      local_28 = Buffer::readvFd(&this->m_inputBuffer,fd,(int *)((long)&n + 4));
      local_1041 = local_28 == -1 && n._4_4_ == 4;
    } while (local_1041);
    if (local_28 < 1) break;
    (this->m_netStatInfo).m_recvBytes = local_28 + (this->m_netStatInfo).m_recvBytes;
  }
  if (local_28 == 0) {
    handleClose(this);
  }
  else {
    bVar1 = sockets::sz_wouldblock();
    if (!bVar1) {
      Logger::SourceFile::SourceFile<104>
                ((SourceFile *)local_1008,
                 (char (*) [104])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
                );
      file._12_4_ = 0;
      file.m_data = (char *)local_1008._0_8_;
      file.m_size = local_1008._8_4_;
      Logger::Logger(&local_ff8,file,0x158,false);
      this_01 = Logger::stream(&local_ff8);
      LogStream::operator<<(this_01,"TcpConnection::handleRead");
      Logger::~Logger(&local_ff8);
      handleError(this);
      handleClose(this);
    }
    std::enable_shared_from_this<sznet::net::TcpConnection>::shared_from_this(local_1028);
    std::
    function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
    ::operator()(&this->m_messageCallback,(shared_ptr<sznet::net::TcpConnection> *)local_1028,
                 &this->m_inputBuffer,(Timestamp)this_local);
    std::shared_ptr<sznet::net::TcpConnection>::~shared_ptr
              ((shared_ptr<sznet::net::TcpConnection> *)local_1028);
  }
  return;
}

Assistant:

void TcpConnection::handleRead(Timestamp receiveTime)
{
	m_loop->assertInLoopThread();
	int savedErrno = 0;
	sz_ssize_t n = 0;
	while (true)
	{
		do
		{
			n = m_inputBuffer.readvFd(m_channel->fd(), &savedErrno);
		} while (n == -1 && savedErrno == sz_err_eintr);
		if (n > 0)
		{
			m_netStatInfo.m_recvBytes += n;
		}
		else if (n == 0)
		{
			handleClose();
			return;
		}
		else
		{
			if (!sockets::sz_wouldblock())
			{
				LOG_SYSERR << "TcpConnection::handleRead";
				handleError();
				handleClose();
			}
			// ����ȫ����ȡ����
			break;
		}
	}
	// ��������
	m_messageCallback(shared_from_this(), &m_inputBuffer, receiveTime);
}